

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatMem.c
# Opt level: O0

char * Msat_MmStepEntryFetch(Msat_MmStep_t *p,int nBytes)

{
  int nBytes_local;
  Msat_MmStep_t *p_local;
  
  if (nBytes == 0) {
    p_local = (Msat_MmStep_t *)0x0;
  }
  else if (p->nMapSize < nBytes) {
    p_local = (Msat_MmStep_t *)malloc((long)nBytes);
  }
  else {
    p_local = (Msat_MmStep_t *)Msat_MmFixedEntryFetch(p->pMap[nBytes]);
  }
  return (char *)p_local;
}

Assistant:

char * Msat_MmStepEntryFetch( Msat_MmStep_t * p, int nBytes )
{
    if ( nBytes == 0 )
        return NULL;
    if ( nBytes > p->nMapSize )
    {
//        printf( "Allocating %d bytes.\n", nBytes );
        return ABC_ALLOC( char, nBytes );
    }
    return Msat_MmFixedEntryFetch( p->pMap[nBytes] );
}